

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int sock_init_with_ip(SOCKINFO *info,SOCKET sockfd,sockaddr *foreign_sockaddr)

{
  int ret;
  sockaddr *foreign_sockaddr_local;
  SOCKET sockfd_local;
  SOCKINFO *info_local;
  
  info_local._4_4_ = sock_init(info,sockfd);
  if (info_local._4_4_ == 0) {
    memcpy(&info->foreign_sockaddr,foreign_sockaddr,0x80);
    info_local._4_4_ = 0;
  }
  return info_local._4_4_;
}

Assistant:

int sock_init_with_ip(
	SOCKINFO *info, SOCKET sockfd, struct sockaddr *foreign_sockaddr)
{
	int ret;

	ret = sock_init(info, sockfd);
	if (ret != UPNP_E_SUCCESS) {
		return ret;
	}

	memcpy(&info->foreign_sockaddr,
		foreign_sockaddr,
		sizeof(info->foreign_sockaddr));

	return UPNP_E_SUCCESS;
}